

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O1

pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
 __thiscall
spvtools::opt::analysis::TypeManager::GetTypeAndPointerType
          (TypeManager *this,uint32_t id,StorageClass sc)

{
  Type *type;
  IRContext *this_00;
  StorageClass in_ECX;
  tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  extraout_RDX;
  __uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
  extraout_RDX_00;
  __uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  _Var1;
  undefined4 in_register_00000034;
  pair<spvtools::opt::analysis::Type_*,_std::unique_ptr<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>_>
  pVar2;
  
  type = GetType((TypeManager *)CONCAT44(in_register_00000034,id),sc);
  if (type == (Type *)0x0) {
    this->consumer_ = (MessageConsumer *)0x0;
    this->context_ = (IRContext *)0x0;
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  else {
    this_00 = (IRContext *)operator_new(0x38);
    Pointer::Pointer((Pointer *)this_00,type,in_ECX);
    this->consumer_ = (MessageConsumer *)type;
    this->context_ = this_00;
    _Var1._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
    .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
         (tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
          )(tuple<spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
            )extraout_RDX_00.
             super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  }
  pVar2.second._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::analysis::Pointer,_std::default_delete<spvtools::opt::analysis::Pointer>,_true,_true>
          )_Var1._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::Pointer_*,_std::default_delete<spvtools::opt::analysis::Pointer>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::Pointer_*,_false>._M_head_impl;
  pVar2.first = (Type *)this;
  return pVar2;
}

Assistant:

std::pair<Type*, std::unique_ptr<Pointer>> TypeManager::GetTypeAndPointerType(
    uint32_t id, spv::StorageClass sc) const {
  Type* type = GetType(id);
  if (type) {
    return std::make_pair(type, MakeUnique<Pointer>(type, sc));
  } else {
    return std::make_pair(type, std::unique_ptr<Pointer>());
  }
}